

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcInventory::IfcInventory(IfcInventory *this)

{
  IfcInventory *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x160,"IfcInventory");
  IfcGroup::IfcGroup((IfcGroup *)this,&PTR_construction_vtable_24__00ff2fc0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcInventory,_6UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcInventory,_6UL>,
             &PTR_construction_vtable_24__00ff3070);
  *(undefined8 *)this = 0xff2ee0;
  *(undefined8 *)&this->field_0x160 = 0xff2fa8;
  *(undefined8 *)&this->field_0x88 = 0xff2f08;
  *(undefined8 *)&this->field_0x98 = 0xff2f30;
  *(undefined8 *)&this->field_0xd0 = 0xff2f58;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcInventory,_6UL>)._vptr_ObjectHelper =
       (_func_int **)0xff2f80;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcInventory,_6UL>).field_0x10);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr(&this->Jurisdiction);
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_1UL,_0UL>::ListOf
            (&this->ResponsiblePersons);
  STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>::Lazy(&this->LastUpdateDate,(LazyObject *)0x0)
  ;
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>::Maybe
            (&this->CurrentValue);
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>::Maybe
            (&this->OriginalValue);
  return;
}

Assistant:

IfcInventory() : Object("IfcInventory") {}